

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

qualifierSet *
gl4cts::GLSL420Pack::Utils::prepareQualifiersSet
          (qualifierSet *__return_storage_ptr__,qualifierSet *in_qualifiers,SHADER_STAGES stage,
          VARIABLE_STORAGE storage)

{
  QUALIFIERS qualifier_00;
  pointer pQVar1;
  bool bVar2;
  undefined8 in_RAX;
  uint uVar3;
  QUALIFIERS qualifier;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    pQVar1 = (in_qualifiers->
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(in_qualifiers->
                      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pQVar1 >> 2) <=
        (ulong)uVar3) break;
    qualifier_00 = pQVar1[uVar3];
    uStack_38 = CONCAT44(qualifier_00,(undefined4)uStack_38);
    bVar2 = doesStageSupportQualifier(stage,storage,qualifier_00);
    if (bVar2) {
      if (storage == UNIFORM) {
        if ((qualifier_00 & ~QUAL_CONST) == QUAL_IN) {
          uStack_38 = CONCAT44(5,(undefined4)uStack_38);
        }
      }
      else if (storage == OUTPUT) {
        if ((qualifier_00 == QUAL_UNIFORM) || (qualifier_00 == QUAL_IN)) {
          uStack_38 = CONCAT44(3,(undefined4)uStack_38);
        }
      }
      else if ((storage == INPUT) && ((qualifier_00 == QUAL_UNIFORM || (qualifier_00 == QUAL_OUT))))
      {
        uStack_38 = CONCAT44(2,(undefined4)uStack_38);
      }
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::push_back(__return_storage_ptr__,(value_type *)((long)&uStack_38 + 4));
    }
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Utils::qualifierSet Utils::prepareQualifiersSet(const qualifierSet& in_qualifiers, SHADER_STAGES stage,
												VARIABLE_STORAGE storage)
{
	qualifierSet result;

	for (GLuint i = 0; i < in_qualifiers.size(); ++i)
	{
		Utils::QUALIFIERS qualifier = in_qualifiers[i];

		if (false == doesStageSupportQualifier(stage, storage, qualifier))
		{
			continue;
		};

		/* Replace wrong storage qualifiers */
		if ((Utils::INPUT == storage) && ((Utils::QUAL_UNIFORM == qualifier) || (Utils::QUAL_OUT == qualifier)))
		{
			qualifier = QUAL_IN;
		}
		else if ((Utils::OUTPUT == storage) && ((Utils::QUAL_IN == qualifier) || (Utils::QUAL_UNIFORM == qualifier)))
		{
			qualifier = QUAL_OUT;
		}
		else if ((Utils::UNIFORM == storage) && ((Utils::QUAL_IN == qualifier) || (Utils::QUAL_OUT == qualifier)))
		{
			qualifier = QUAL_UNIFORM;
		}

		result.push_back(qualifier);
	}

	return result;
}